

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceDistanceGraphPath.cc
# Opt level: O0

bool __thiscall
SequenceDistanceGraphPath::operator==
          (SequenceDistanceGraphPath *this,SequenceDistanceGraphPath *rhs)

{
  byte bVar1;
  SequenceDistanceGraphPath *in_RDI;
  set<long,_std::less<long>,_std::allocator<long>_> *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  
  make_set_of_nodes(in_RDI);
  make_set_of_nodes(in_RDI);
  bVar1 = std::operator==((set<long,_std::less<long>,_std::allocator<long>_> *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff78);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)0x38aec6);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)0x38aed0);
  return (bool)(bVar1 & 1);
}

Assistant:

bool SequenceDistanceGraphPath::operator==(const SequenceDistanceGraphPath& rhs) const {
    return make_set_of_nodes() == rhs.make_set_of_nodes();
}